

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan_state.cpp
# Opt level: O1

void __thiscall
duckdb::TableScanState::Initialize
          (TableScanState *this,vector<duckdb::StorageIndex,_true> *column_ids_p,
          optional_ptr<duckdb::ClientContext,_true> context,
          optional_ptr<duckdb::TableFilterSet,_true> table_filters,
          optional_ptr<duckdb::SampleOptions,_true> table_sampling)

{
  optional_ptr<duckdb::ClientContext,_true> context_00;
  idx_t seed;
  double dVar1;
  optional_ptr<duckdb::SampleOptions,_true> local_40;
  optional_ptr<duckdb::TableFilterSet,_true> local_38;
  optional_ptr<duckdb::ClientContext,_true> local_30;
  
  local_40.ptr = table_sampling.ptr;
  local_38.ptr = table_filters.ptr;
  local_30.ptr = context.ptr;
  ::std::vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>::_M_move_assign
            (&(this->column_ids).
              super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>);
  if (local_38.ptr != (TableFilterSet *)0x0) {
    optional_ptr<duckdb::ClientContext,_true>::CheckValid(&local_30);
    context_00.ptr = local_30.ptr;
    optional_ptr<duckdb::TableFilterSet,_true>::CheckValid(&local_38);
    ScanFilterInfo::Initialize(&this->filters,context_00.ptr,local_38.ptr,&this->column_ids);
  }
  if (local_40.ptr != (SampleOptions *)0x0) {
    optional_ptr<duckdb::SampleOptions,_true>::CheckValid(&local_40);
    (this->sampling_info).do_system_sample = (local_40.ptr)->method == SYSTEM_SAMPLE;
    optional_ptr<duckdb::SampleOptions,_true>::CheckValid(&local_40);
    dVar1 = Value::GetValue<double>(&(local_40.ptr)->sample_size);
    (this->sampling_info).sample_rate = dVar1 / 100.0;
    optional_ptr<duckdb::SampleOptions,_true>::CheckValid(&local_40);
    if (((local_40.ptr)->seed).index != 0xffffffffffffffff) {
      optional_ptr<duckdb::SampleOptions,_true>::CheckValid(&local_40);
      seed = optional_idx::GetIndex(&(local_40.ptr)->seed);
      RandomEngine::SetSeed(&(this->table_state).random,seed);
    }
  }
  return;
}

Assistant:

void TableScanState::Initialize(vector<StorageIndex> column_ids_p, optional_ptr<ClientContext> context,
                                optional_ptr<TableFilterSet> table_filters,
                                optional_ptr<SampleOptions> table_sampling) {
	this->column_ids = std::move(column_ids_p);
	if (table_filters) {
		filters.Initialize(*context, *table_filters, column_ids);
	}
	if (table_sampling) {
		sampling_info.do_system_sample = table_sampling->method == SampleMethod::SYSTEM_SAMPLE;
		sampling_info.sample_rate = table_sampling->sample_size.GetValue<double>() / 100.0;
		if (table_sampling->seed.IsValid()) {
			table_state.random.SetSeed(table_sampling->seed.GetIndex());
		}
	}
}